

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int set_size_literal(AV1_COMP *cpi,int width,int height)

{
  aom_codec_err_t aVar1;
  AV1_COMP *cpi_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  aom_codec_err_t err;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffcc;
  AV1_COMP *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  aVar1 = av1_check_initial_width
                    ((AV1_COMP *)CONCAT44(in_ESI,in_EDX),(int)((ulong)cpi_00 >> 0x20),(int)cpi_00,
                     in_stack_ffffffffffffffdc);
  if (aVar1 != AOM_CODEC_OK) {
    aom_internal_error(*(aom_internal_error_info **)
                        (cpi_00->enc_quant_dequant_params).quants.y_quant[2],
                       (aom_codec_err_t)(ulong)aVar1,"av1_check_initial_width() failed");
  }
  if ((in_ESI < 1) || (in_EDX < 1)) {
    local_4 = 1;
  }
  else {
    *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 4) = in_ESI;
    *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 6) = in_EDX;
    if ((*(int *)(in_RDI + 0x712f4) <
         *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 4)) ||
       (*(int *)(in_RDI + 0x712f8) <
        *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 6))) {
      av1_free_context_buffers((AV1_COMMON *)0x21b0da);
      av1_free_shared_coeff_buffer((PC_TREE_SHARED_BUFFERS *)in_stack_ffffffffffffffd0);
      av1_free_sms_tree((ThreadData_conflict *)0x21b103);
      in_stack_ffffffffffffffd0 = *(AV1_COMP **)(in_RDI + 0x3adb8);
      av1_num_planes((AV1_COMMON *)cpi_00);
      av1_free_pmc((PICK_MODE_CONTEXT *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      *(undefined8 *)(in_RDI + 0x3adb8) = 0;
      alloc_compressor_data(in_stack_ffffffffffffffd0);
      realloc_segmentation_maps(in_stack_ffffffffffffffd0);
      *(undefined4 *)(in_RDI + 0x712f4) =
           *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 4);
      *(undefined4 *)(in_RDI + 0x712f8) =
           *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 6);
      *(undefined1 *)(in_RDI + 0x71300) = 0;
    }
    alloc_mb_mode_info_buffers(in_stack_ffffffffffffffd0);
    av1_update_frame_size(cpi_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int set_size_literal(AV1_COMP *cpi, int width, int height) {
  AV1_COMMON *cm = &cpi->common;
  aom_codec_err_t err = av1_check_initial_width(
      cpi, cm->seq_params->use_highbitdepth, cm->seq_params->subsampling_x,
      cm->seq_params->subsampling_y);
  if (err != AOM_CODEC_OK) {
    aom_internal_error(cm->error, err, "av1_check_initial_width() failed");
  }

  if (width <= 0 || height <= 0) return 1;

  cm->width = width;
  cm->height = height;

#if CONFIG_AV1_TEMPORAL_DENOISING
  setup_denoiser_buffer(cpi);
#endif

  if (cm->width > cpi->data_alloc_width ||
      cm->height > cpi->data_alloc_height) {
    av1_free_context_buffers(cm);
    av1_free_shared_coeff_buffer(&cpi->td.shared_coeff_buf);
    av1_free_sms_tree(&cpi->td);
    av1_free_pmc(cpi->td.firstpass_ctx, av1_num_planes(cm));
    cpi->td.firstpass_ctx = NULL;
    alloc_compressor_data(cpi);
    realloc_segmentation_maps(cpi);
    cpi->data_alloc_width = cm->width;
    cpi->data_alloc_height = cm->height;
    cpi->frame_size_related_setup_done = false;
  }
  alloc_mb_mode_info_buffers(cpi);
  av1_update_frame_size(cpi);

  return 0;
}